

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O2

bool cmCreateTestSourceList
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  char *__s;
  cmMakefile *pcVar1;
  size_type sVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  pointer pbVar6;
  string *a;
  string *psVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  cmSourceFile *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sourceName;
  pointer pbVar11;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  allocator<char> local_1d9;
  cmExecutionStatus *local_1d8;
  string sourceListValue;
  string driver;
  string local_190;
  cmMakefile *local_170;
  cmNewLineStyle local_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  string functionMapCode;
  string local_138;
  string extraInclude;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string configFile;
  string function;
  string local_70;
  string forwardDeclareCode;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = status;
  if ((ulong)((long)pbVar6 - (long)pbVar11) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraInclude,"called with wrong number of arguments.",
               (allocator<char> *)&function);
    std::__cxx11::string::_M_assign((string *)&local_1d8->Error);
    std::__cxx11::string::~string((string *)&extraInclude);
    local_1d8._0_1_ = 0;
  }
  else {
    extraInclude._M_dataplus._M_p = (pointer)&extraInclude.field_2;
    extraInclude._M_string_length = 0;
    function._M_dataplus._M_p = (pointer)&function.field_2;
    function._M_string_length = 0;
    extraInclude.field_2._M_local_buf[0] = '\0';
    function.field_2._M_local_buf[0] = '\0';
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (; pbVar3 = tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, pbVar11 != pbVar6;
        pbVar11 = pbVar11 + 1) {
      bVar4 = std::operator==(pbVar11,"EXTRA_INCLUDE");
      if (bVar4) {
        if (pbVar11 + 1 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&driver,"incorrect arguments to EXTRA_INCLUDE",
                     (allocator<char> *)&configFile);
          std::__cxx11::string::_M_assign((string *)&local_1d8->Error);
          goto LAB_002cef0a;
        }
        cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[3]>
                  (&driver,(char (*) [11])"#include \"",pbVar11 + 1,(char (*) [3])0x702875);
        psVar7 = &extraInclude;
LAB_002ce75f:
        pbVar11 = pbVar11 + 1;
        std::__cxx11::string::operator=((string *)psVar7,(string *)&driver);
        std::__cxx11::string::~string((string *)&driver);
      }
      else {
        bVar4 = std::operator==(pbVar11,"FUNCTION");
        if (bVar4) {
          if (pbVar11 + 1 !=
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            cmStrCat<std::__cxx11::string_const&,char_const(&)[13]>
                      (&driver,pbVar11 + 1,(char (*) [13])"(&ac, &av);\n");
            psVar7 = &function;
            goto LAB_002ce75f;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&driver,"incorrect arguments to FUNCTION",
                     (allocator<char> *)&configFile);
          std::__cxx11::string::_M_assign((string *)&local_1d8->Error);
          goto LAB_002cef0a;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tests,pbVar11);
      }
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    __s = ((tests.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    psVar7 = tests.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    cmsys::SystemTools::GetFilenameExtension(&driver,psVar7);
    std::__cxx11::string::~string((string *)&driver);
    if (driver._M_string_length < 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&driver,"You must specify a file extension for the test driver file.",
                 (allocator<char> *)&configFile);
      std::__cxx11::string::_M_assign((string *)&local_1d8->Error);
LAB_002cef0a:
      std::__cxx11::string::~string((string *)&driver);
      local_1d8 = (cmExecutionStatus *)((ulong)local_1d8 & 0xffffffff00000000);
    }
    else {
      pcVar1 = local_1d8->Makefile;
      a = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
      configFile._M_dataplus._M_p._0_1_ = 0x2f;
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&driver,a,(char *)&configFile,psVar7);
      psVar7 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      std::__cxx11::string::string((string *)&configFile,(string *)psVar7);
      local_170 = pcVar1;
      std::__cxx11::string::append((char *)&configFile);
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      forwardDeclareCode._M_dataplus._M_p = (pointer)&forwardDeclareCode.field_2;
      forwardDeclareCode._M_string_length = 0;
      forwardDeclareCode.field_2._M_local_buf[0] = '\0';
      pbVar10 = pbVar3 + 2;
      local_160 = pbVar10;
      for (; pbVar10 !=
             tests.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
        bVar4 = std::operator==(pbVar10,"EXTRA_INCLUDE");
        if (bVar4) break;
        functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
        functionMapCode._M_string_length = 0;
        functionMapCode.field_2._M_local_buf[0] = '\0';
        cmsys::SystemTools::GetFilenamePath(&sourceListValue,pbVar10);
        sVar2 = sourceListValue._M_string_length;
        std::__cxx11::string::~string((string *)&sourceListValue);
        if (sVar2 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&sourceListValue,pbVar10);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          psVar7 = &sourceListValue;
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_190,pbVar10);
          local_70._M_dataplus._M_p._0_1_ = 0x2f;
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_138,pbVar10);
          cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                    (&sourceListValue,&local_190,(char *)&local_70,&local_138);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          std::__cxx11::string::~string((string *)&sourceListValue);
          std::__cxx11::string::~string((string *)&local_138);
          psVar7 = &local_190;
        }
        std::__cxx11::string::~string((string *)psVar7);
        cmsys::SystemTools::ConvertToUnixSlashes(&functionMapCode);
        cmsys::SystemTools::MakeCidentifier(&sourceListValue,&functionMapCode);
        std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
        std::__cxx11::string::~string((string *)&sourceListValue);
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (tests_func_name.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           tests_func_name.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&functionMapCode);
        pbVar11 = tests_func_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tests_func_name,&functionMapCode);
        if (_Var8._M_current == pbVar11) {
          cmStrCat<char_const(&)[5],std::__cxx11::string&,char_const(&)[17]>
                    (&sourceListValue,(char (*) [5])"int ",&functionMapCode,
                     (char (*) [17])"(int, char*[]);\n");
          std::__cxx11::string::append((string *)&forwardDeclareCode);
          std::__cxx11::string::~string((string *)&sourceListValue);
        }
        std::__cxx11::string::~string((string *)&functionMapCode);
      }
      functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
      functionMapCode._M_string_length = 0;
      functionMapCode.field_2._M_local_buf[0] = '\0';
      local_1d8 = (cmExecutionStatus *)
                  tests_func_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar10 = local_160; sourceName = local_160, pcVar1 = local_170, psVar7 = &local_190,
          pbVar10 !=
          tests.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        sourceListValue._M_string_length = 0;
        sourceListValue.field_2._M_local_buf[0] = '\0';
        cmsys::SystemTools::GetFilenamePath(psVar7,pbVar10);
        sVar2 = local_190._M_string_length;
        std::__cxx11::string::~string((string *)psVar7);
        if (sVar2 == 0) {
          cmsys::SystemTools::GetFilenameWithoutLastExtension(psVar7,pbVar10);
          std::__cxx11::string::operator=((string *)&sourceListValue,(string *)psVar7);
        }
        else {
          cmsys::SystemTools::GetFilenamePath(&local_138,pbVar10);
          local_1d9 = (allocator<char>)0x2f;
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_70,pbVar10);
          cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                    (&local_190,&local_138,(char *)&local_1d9,&local_70);
          std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_70);
          psVar7 = &local_138;
        }
        std::__cxx11::string::~string((string *)psVar7);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::append((string *)&functionMapCode);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::append((string *)&functionMapCode);
        std::__cxx11::string::append((char *)&functionMapCode);
        std::__cxx11::string::~string((string *)&sourceListValue);
        local_1d8 = (cmExecutionStatus *)((long)local_1d8 + 0x20);
      }
      if (extraInclude._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                   (allocator<char> *)&local_190);
        value._M_str = extraInclude._M_dataplus._M_p;
        value._M_len = extraInclude._M_string_length;
        cmMakefile::AddDefinition(pcVar1,&sourceListValue,value);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      if (function._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                   (allocator<char> *)&local_190);
        value_00._M_str = function._M_dataplus._M_p;
        value_00._M_len = function._M_string_length;
        cmMakefile::AddDefinition(pcVar1,&sourceListValue,value_00);
        std::__cxx11::string::~string((string *)&sourceListValue);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceListValue,"CMAKE_FORWARD_DECLARE_TESTS",
                 (allocator<char> *)&local_190);
      value_01._M_str = forwardDeclareCode._M_dataplus._M_p;
      value_01._M_len = forwardDeclareCode._M_string_length;
      cmMakefile::AddDefinition(pcVar1,&sourceListValue,value_01);
      std::__cxx11::string::~string((string *)&sourceListValue);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sourceListValue,"CMAKE_FUNCTION_TABLE_ENTRIES",
                 (allocator<char> *)&local_190);
      value_02._M_str = functionMapCode._M_dataplus._M_p;
      value_02._M_len = functionMapCode._M_string_length;
      cmMakefile::AddDefinition(pcVar1,&sourceListValue,value_02);
      std::__cxx11::string::~string((string *)&sourceListValue);
      cmNewLineStyle::cmNewLineStyle(&local_164);
      iVar5 = cmMakefile::ConfigureFile(pcVar1,&configFile,&driver,false,true,false,0,local_164);
      local_1d8 = (cmExecutionStatus *)
                  CONCAT44(local_1d8._4_4_,CONCAT31((int3)((uint)iVar5 >> 8),iVar5 != 0));
      sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
      sourceListValue._M_string_length = 0;
      sourceListValue.field_2._M_local_buf[0] = '\0';
      pcVar9 = cmMakefile::GetOrCreateSource(pcVar1,&driver,false,Ambiguous);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"ABSTRACT",(allocator<char> *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"0",&local_1d9);
      cmSourceFile::SetProperty(pcVar9,&local_190,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::_M_assign((string *)&sourceListValue);
      for (; sourceName !=
             tests.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; sourceName = sourceName + 1) {
        pcVar9 = cmMakefile::GetOrCreateSource(local_170,sourceName,false,Ambiguous);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"ABSTRACT",(allocator<char> *)&local_70);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"0",&local_1d9);
        cmSourceFile::SetProperty(pcVar9,&local_190,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::push_back((char)&sourceListValue);
        std::__cxx11::string::append((string *)&sourceListValue);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,__s,(allocator<char> *)&local_138);
      value_03._M_str = sourceListValue._M_dataplus._M_p;
      value_03._M_len = sourceListValue._M_string_length;
      cmMakefile::AddDefinition(local_170,&local_190,value_03);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&sourceListValue);
      std::__cxx11::string::~string((string *)&functionMapCode);
      std::__cxx11::string::~string((string *)&forwardDeclareCode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tests_func_name);
      std::__cxx11::string::~string((string *)&configFile);
      std::__cxx11::string::~string((string *)&driver);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tests);
    std::__cxx11::string::~string((string *)&function);
    std::__cxx11::string::~string((string *)&extraInclude);
  }
  return (bool)local_1d8._0_1_;
}

Assistant:

bool cmCreateTestSourceList(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with wrong number of arguments.");
    return false;
  }

  auto i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for (; i != args.end(); i++) {
    if (*i == "EXTRA_INCLUDE") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
      }
      extraInclude = cmStrCat("#include \"", *i, "\"\n");
    } else if (*i == "FUNCTION") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to FUNCTION");
        return false;
      }
      function = cmStrCat(*i, "(&ac, &av);\n");
    } else {
      tests.push_back(*i);
    }
  }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2) {
    status.SetError(
      "You must specify a file extension for the test driver file.");
    return false;
  }
  cmMakefile& mf = status.GetMakefile();
  std::string driver = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', *i);
  ++i;

  std::string configFile = cmSystemTools::GetCMakeRoot();

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  auto testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for (i = testsBegin; i != tests.end(); ++i) {
    if (*i == "EXTRA_INCLUDE") {
      break;
    }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmStrCat(cmSystemTools::GetFilenamePath(*i), '/',
                           cmSystemTools::GetFilenameWithoutLastExtension(*i));
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    func_name = cmSystemTools::MakeCidentifier(func_name);
    bool already_declared =
      std::find(tests_func_name.begin(), tests_func_name.end(), func_name) !=
      tests_func_name.end();
    tests_func_name.push_back(func_name);
    if (!already_declared) {
      forwardDeclareCode += cmStrCat("int ", func_name, "(int, char*[]);\n");
    }
  }

  std::string functionMapCode;
  std::vector<std::string>::iterator j;
  for (i = testsBegin, j = tests_func_name.begin(); i != tests.end();
       ++i, ++j) {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmStrCat(cmSystemTools::GetFilenamePath(*i), '/',
                           cmSystemTools::GetFilenameWithoutLastExtension(*i));
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    functionMapCode += "  {\n"
                       "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
                       "    ";
    functionMapCode += *j;
    functionMapCode += "\n"
                       "  },\n";
  }
  if (!extraInclude.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES", extraInclude);
  }
  if (!function.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION", function);
  }
  mf.AddDefinition("CMAKE_FORWARD_DECLARE_TESTS", forwardDeclareCode);
  mf.AddDefinition("CMAKE_FUNCTION_TABLE_ENTRIES", functionMapCode);
  bool res = true;
  if (!mf.ConfigureFile(configFile, driver, false, true, false)) {
    res = false;
  }

  // Construct the source list.
  std::string sourceListValue;
  {
    cmSourceFile* sf = mf.GetOrCreateSource(driver);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue = driver;
  }
  for (i = testsBegin; i != tests.end(); ++i) {
    cmSourceFile* sf = mf.GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue += ';';
    sourceListValue += *i;
  }

  mf.AddDefinition(sourceList, sourceListValue);
  return res;
}